

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

Own<capnp::SchemaFile,_std::nullptr_t>
capnp::SchemaFile::newFromDirectory
          (ReadableDirectory *baseDir,Path *path,
          ArrayPtr<const_kj::ReadableDirectory_*const> importPath,
          Maybe<kj::String> *displayNameOverride)

{
  ReadableFile *pRVar1;
  DiskSchemaFile *pDVar2;
  DiskSchemaFile *extraout_RDX;
  Maybe<kj::String> *in_R9;
  Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> OVar3;
  Own<capnp::SchemaFile,_std::nullptr_t> OVar4;
  PathPtr path_00;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  ArrayPtr<const_kj::ReadableDirectory_*const> local_40;
  
  local_40.ptr = (ReadableDirectory **)importPath.size_;
  path_00.parts.size_ = (size_t)(((Path *)importPath.ptr)->parts).ptr;
  path_00.parts.ptr = (String *)path;
  local_40.size_ = (size_t)displayNameOverride;
  kj::ReadableDirectory::openFile((ReadableDirectory *)&local_68,path_00);
  OVar3 = kj::
          heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::Maybe<kj::String>>
                    ((kj *)&local_58,(ReadableDirectory *)path,(Path *)importPath.ptr,&local_40,
                     &local_68,in_R9);
  pRVar1 = local_68.ptr;
  pDVar2 = OVar3.ptr;
  *(undefined4 *)&(baseDir->super_FsNode)._vptr_FsNode = local_58;
  *(undefined4 *)((long)&(baseDir->super_FsNode)._vptr_FsNode + 4) = uStack_54;
  *(undefined4 *)&baseDir[1].super_FsNode._vptr_FsNode = (undefined4)uStack_50;
  *(undefined4 *)((long)&baseDir[1].super_FsNode._vptr_FsNode + 4) = uStack_50._4_4_;
  uStack_50 = 0;
  if (local_68.ptr != (ReadableFile *)0x0) {
    local_68.ptr = (ReadableFile *)0x0;
    (**(local_68.disposer)->_vptr_Disposer)
              (local_68.disposer,
               (pRVar1->super_FsNode)._vptr_FsNode[-2] + (long)&(pRVar1->super_FsNode)._vptr_FsNode)
    ;
    pDVar2 = extraout_RDX;
  }
  OVar4.ptr = &pDVar2->super_SchemaFile;
  OVar4.disposer = (Disposer *)baseDir;
  return OVar4;
}

Assistant:

kj::Own<SchemaFile> SchemaFile::newFromDirectory(
    const kj::ReadableDirectory& baseDir, kj::Path path,
    kj::ArrayPtr<const kj::ReadableDirectory* const> importPath,
    kj::Maybe<kj::String> displayNameOverride) {
  return kj::heap<DiskSchemaFile>(baseDir, kj::mv(path), importPath, baseDir.openFile(path),
                                  kj::mv(displayNameOverride));
}